

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

void __thiscall r_exec::Group::inject_existing_object(Group *this,View *view)

{
  atomic_int_fast64_t *paVar1;
  pointer *pppOVar2;
  multiset<core::P<r_exec::View>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
  *this_00;
  _Object *p_Var3;
  iterator iVar4;
  char cVar5;
  ushort uVar6;
  int iVar7;
  undefined4 extraout_var;
  Operation *pOVar8;
  uint64_t uVar9;
  ulong uVar10;
  float fVar11;
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar12;
  _Alloc_node __an;
  _Alloc_node local_b8;
  key_type local_b0;
  float local_a4;
  pthread_mutex_t *local_a0;
  undefined1 local_98 [16];
  double local_88;
  double local_78;
  undefined8 local_68;
  undefined1 local_58 [16];
  undefined8 local_48;
  View *this_01;
  
  local_98._8_8_ = local_98._0_8_;
  p_Var3 = (view->super_View).object.object;
  (*p_Var3->_vptr__Object[0x11])(p_Var3);
  iVar7 = (*p_Var3->_vptr__Object[0x18])(p_Var3,this,0);
  this_01 = (View *)CONCAT44(extraout_var,iVar7);
  if (this_01 == (View *)0x0) {
    local_b8._M_t =
         (_Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
          *)&p_Var3[5].refCount;
    local_b0.object = (_Object *)view;
    std::
    _Hashtable<r_code::View*,r_code::View*,std::allocator<r_code::View*>,std::__detail::_Identity,r_code::View::Equal,r_code::View::Hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<r_code::View*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<r_code::View*,true>>>>
              ();
    (*p_Var3->_vptr__Object[0x12])(p_Var3);
    inject(this,view);
  }
  else {
    (*p_Var3->_vptr__Object[0x12])(p_Var3);
    local_a0 = (pthread_mutex_t *)&this->mutex;
    iVar7 = pthread_mutex_lock(local_a0);
    if (iVar7 != 0) {
      std::__throw_system_error(iVar7);
    }
    pOVar8 = (Operation *)operator_new(0x20);
    uVar9 = r_exec::View::get_oid(this_01);
    fVar11 = r_exec::View::get_res(view);
    pOVar8->oid = uVar9;
    *(undefined2 *)&pOVar8[1]._vptr_Operation = 4;
    pOVar8[1].oid = (uint64_t)(double)fVar11;
    pOVar8->_vptr_Operation = (_func_int **)&PTR__Operation_001bfd28;
    iVar4._M_current =
         (this->pending_operations).
         super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_98._0_8_ = &this->pending_operations;
    local_b8._M_t =
         (_Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
          *)pOVar8;
    if (iVar4._M_current ==
        (this->pending_operations).
        super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
      _M_realloc_insert<r_exec::Group::Operation*>
                ((vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>> *)
                 &this->pending_operations,iVar4,(Operation **)&local_b8);
    }
    else {
      *iVar4._M_current = pOVar8;
      pppOVar2 = &(this->pending_operations).
                  super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
    pOVar8 = (Operation *)operator_new(0x20);
    uVar9 = r_exec::View::get_oid(this_01);
    fVar11 = r_exec::View::get_sln(view);
    pOVar8->oid = uVar9;
    *(undefined2 *)&pOVar8[1]._vptr_Operation = 3;
    pOVar8[1].oid = (uint64_t)(double)fVar11;
    pOVar8->_vptr_Operation = (_func_int **)&PTR__Operation_001bfd28;
    iVar4._M_current =
         (this->pending_operations).
         super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8._M_t =
         (_Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
          *)pOVar8;
    if (iVar4._M_current ==
        (this->pending_operations).
        super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
      _M_realloc_insert<r_exec::Group::Operation*>
                ((vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>> *)
                 local_98._0_8_,iVar4,(Operation **)&local_b8);
    }
    else {
      *iVar4._M_current = pOVar8;
      pppOVar2 = &(this->pending_operations).
                  super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
    (*p_Var3->_vptr__Object[4])(p_Var3,0);
    cVar5 = r_code::Atom::getDescriptor();
    if ((byte)(cVar5 + 0x37U) < 6) {
      pOVar8 = (Operation *)operator_new(0x20);
      uVar9 = r_exec::View::get_oid(this_01);
      fVar11 = r_exec::View::get_act(view);
      pOVar8->oid = uVar9;
      *(undefined2 *)&pOVar8[1]._vptr_Operation = 7;
      pOVar8[1].oid = (uint64_t)(double)fVar11;
      pOVar8->_vptr_Operation = (_func_int **)&PTR__Operation_001bfd28;
      iVar4._M_current =
           (this->pending_operations).
           super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_b8._M_t =
           (_Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
            *)pOVar8;
      if (iVar4._M_current ==
          (this->pending_operations).
          super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>>::
        _M_realloc_insert<r_exec::Group::Operation*>
                  ((vector<r_exec::Group::Operation*,std::allocator<r_exec::Group::Operation*>> *)
                   local_98._0_8_,iVar4,(Operation **)&local_b8);
      }
      else {
        *iVar4._M_current = pOVar8;
        pppOVar2 = &(this->pending_operations).
                    super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
    }
    r_code::Atom::operator=
              ((Atom *)&(this_01->super_View).field_0x2c,(Atom *)&(view->super_View).field_0x2c);
    uVar10 = (*Now)();
    uVar6 = r_code::Atom::asIndex();
    r_code::Utils::SetTimestamp
              ((Atom *)((long)(this_01->super_View).references + (ulong)uVar6 * 4 + 0x18),uVar10);
    local_98._0_4_ = r_exec::View::get_sln(view);
    local_98._4_12_ = extraout_var_00;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    local_48 = r_code::Atom::asFloat();
    local_58._0_4_ = r_exec::View::get_sln(this_01);
    local_58._4_12_ = extraout_var_01;
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    local_68 = r_code::Atom::asFloat();
    local_78 = update_c_act(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,8);
    local_a4 = (float)r_code::Atom::asFloat();
    local_88 = update_c_sln(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    fVar11 = (float)r_code::Atom::asFloat();
    if (((double)fVar11 < local_88 && (double)local_a4 < local_78) &&
        ((float)local_48 < (float)local_98._0_4_ && (float)local_58._0_4_ <= (float)local_68)) {
      this_00 = &this->newly_salient_views;
      LOCK();
      paVar1 = &(view->super_View).super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
      local_b0.object = (_Object *)view;
      pVar12 = std::
               _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
               ::_M_get_insert_equal_pos(&this_00->_M_t,&local_b0);
      local_b8._M_t = &this_00->_M_t;
      std::
      _Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
      ::
      _M_insert_<core::P<r_exec::View>,std::_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>::_Alloc_node>
                ((_Rb_tree<core::P<r_exec::View>,core::P<r_exec::View>,std::_Identity<core::P<r_exec::View>>,r_code::View::Less,std::allocator<core::P<r_exec::View>>>
                  *)this_00,pVar12.first,pVar12.second,&local_b0,&local_b8);
      if ((View *)local_b0.object != (View *)0x0) {
        LOCK();
        ((local_b0.object)->refCount).super___atomic_base<long>._M_i =
             ((local_b0.object)->refCount).super___atomic_base<long>._M_i + -1;
        UNLOCK();
        if (((local_b0.object)->refCount).super___atomic_base<long>._M_i < 1) {
          (*(((View *)&(local_b0.object)->_vptr__Object)->super__Object)._vptr__Object[1])();
        }
      }
      inject_reduction_jobs(this,view);
    }
    pthread_mutex_unlock(local_a0);
  }
  return;
}

Assistant:

void Group::inject_existing_object(View *view)   // the view can hold anything but groups and notifications.
{
    Code *object = view->object;
    object->acq_views();
    View *existing_view = (View *)object->get_view(this, false);

    if (!existing_view) { // no existing view: add the view to the object's view_map and inject.
        object->views.insert(view);
        object->rel_views();
        inject(view);
    } else { // call set on the ctrl values of the existing view with the new view's ctrl values, including sync. NB: org left unchanged.
        object->rel_views();
        std::lock_guard<std::mutex> guard(mutex);
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_RES, view->get_res()));
        pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_SLN, view->get_sln()));

        switch (object->code(0).getDescriptor()) {
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            pending_operations.push_back(new Group::Set(existing_view->get_oid(), VIEW_ACT, view->get_act()));
            break;
        }

        existing_view->code(VIEW_SYNC) = view->code(VIEW_SYNC);
        existing_view->set_ijt(Now());
        bool wiew_is_salient = view->get_sln() > get_sln_thr();
        bool wiew_was_salient = existing_view->get_sln() > get_sln_thr();
        bool reduce_view = (!wiew_was_salient && wiew_is_salient);
        // give a chance to ipgms to reduce the new view.
        bool group_is_c_active = update_c_act() > get_c_act_thr();
        bool group_is_c_salient = update_c_sln() > get_c_sln_thr();

        if (group_is_c_active && group_is_c_salient && reduce_view) {
            newly_salient_views.insert(view);
            inject_reduction_jobs(view);
        }
    }
}